

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_>::Data
          (Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *this,
          Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *other,size_t reserved)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  unsigned_long_long *puVar4;
  long in_RSI;
  Span<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar5;
  size_t otherNSpans;
  Node<unsigned_long_long,_QRenderRule> *newNode;
  Node<unsigned_long_long,_QRenderRule> *n;
  size_t index;
  Span *span;
  size_t s;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff70;
  Span<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *this_00;
  unsigned_long_long *key;
  size_t in_stack_ffffffffffffffb0;
  ulong i;
  unsigned_long_long *local_40;
  unsigned_long local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  *(undefined8 *)((long)in_RDI->offsets + 8) = *(undefined8 *)(in_RSI + 8);
  *(undefined8 *)((long)in_RDI->offsets + 0x10) = 0;
  *(undefined8 *)((long)in_RDI->offsets + 0x18) = *(undefined8 *)(in_RSI + 0x18);
  *(undefined8 *)((long)in_RDI->offsets + 0x20) = 0;
  qMax<unsigned_long>((unsigned_long *)((long)in_RDI->offsets + 8),&local_20);
  sVar3 = GrowthPolicy::bucketsForCapacity((size_t)in_RDI);
  *(size_t *)((long)in_RDI->offsets + 0x10) = sVar3;
  RVar5 = allocateSpans(in_stack_ffffffffffffffb0);
  *(Span **)((long)in_RDI->offsets + 0x20) = RVar5.spans;
  puVar4 = (unsigned_long_long *)(*(ulong *)(in_RSI + 0x10) >> 7);
  this_00 = in_RDI;
  key = puVar4;
  for (local_40 = (unsigned_long_long *)0x0; local_40 < puVar4;
      local_40 = (unsigned_long_long *)((long)local_40 + 1)) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (i = 0; i < 0x80; i = i + 1) {
      bVar2 = Span<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_>::hasNode
                        ((Span<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *)
                         (lVar1 + (long)local_40 * 0x90),i);
      if (bVar2) {
        Span<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_>::at(this_00,(size_t)in_RDI);
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18 = findBucket<unsigned_long_long>
                             ((Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *)
                              RVar5.spans,key);
        Bucket::insert((Bucket *)0x470217);
        Node<unsigned_long_long,_QRenderRule>::Node
                  ((Node<unsigned_long_long,_QRenderRule> *)this_00,
                   (Node<unsigned_long_long,_QRenderRule> *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }